

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O0

shared_ptr<Liby::UdpSocket> __thiscall
Liby::EventLoopGroup::creatUdpClient(EventLoopGroup *this,string *host,string *service)

{
  string *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<Liby::UdpSocket> sVar2;
  anon_class_24_2_5d35c9e9 local_78;
  ResolverHandler local_60;
  undefined1 local_40 [8];
  weak_ptr<Liby::UdpSocket> weakUdpSocket;
  string *service_local;
  string *host_local;
  EventLoopGroup *this_local;
  shared_ptr<Liby::UdpSocket> *udpSocket;
  
  weakUdpSocket.super___weak_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _7_1_ = 0;
  creatUdpClient(this);
  std::weak_ptr<Liby::UdpSocket>::weak_ptr<Liby::UdpSocket,void>
            ((weak_ptr<Liby::UdpSocket> *)local_40,(shared_ptr<Liby::UdpSocket> *)this);
  local_78.this = (EventLoopGroup *)host;
  std::weak_ptr<Liby::UdpSocket>::weak_ptr
            (&local_78.weakUdpSocket,(weak_ptr<Liby::UdpSocket> *)local_40);
  std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>::
  function<Liby::EventLoopGroup::creatUdpClient(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0,void>
            ((function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)> *)
             &local_60,&local_78);
  Resolver::async_resolve(service,in_RCX,&local_60);
  std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>::
  ~function(&local_60);
  creatUdpClient(std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0::~__0
            ((__0 *)&local_78);
  weakUdpSocket.super___weak_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _7_1_ = 1;
  std::weak_ptr<Liby::UdpSocket>::~weak_ptr((weak_ptr<Liby::UdpSocket> *)local_40);
  _Var1._M_pi = extraout_RDX;
  if ((weakUdpSocket.super___weak_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       ._7_1_ & 1) == 0) {
    std::shared_ptr<Liby::UdpSocket>::~shared_ptr((shared_ptr<Liby::UdpSocket> *)this);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Liby::UdpSocket>)
         sVar2.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<UdpSocket>
EventLoopGroup::creatUdpClient(const std::string &host,
                               const std::string &service) {
    auto udpSocket = creatUdpClient();
    std::weak_ptr<UdpSocket> weakUdpSocket(udpSocket);

    Resolver::async_resolve(host, service,
                            [this, weakUdpSocket](std::list<Endpoint> eps) {
                                if (weakUdpSocket.expired() || eps.empty())
                                    return;

                                auto udpSocket = weakUdpSocket.lock();
                                udpSocket->start();

                                udpSocket->handleConnectEvent(eps.front());
                            });

    return udpSocket;
}